

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O0

void __thiscall
FIXT11::MessageCracker::crack(MessageCracker *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  Header *this_00;
  string *__lhs;
  string *msgTypeValue;
  SessionID *sessionID_local;
  Message *message_local;
  MessageCracker *this_local;
  
  this_00 = FIXT11::Message::getHeader(message);
  __lhs = FIX::FieldMap::getField_abi_cxx11_((FieldMap *)this_00,0x23);
  bVar1 = std::operator==(__lhs,"0");
  if (bVar1) {
    (*this->_vptr_MessageCracker[4])(this,message,sessionID);
  }
  else {
    bVar1 = std::operator==(__lhs,"1");
    if (bVar1) {
      (*this->_vptr_MessageCracker[5])(this,message,sessionID);
    }
    else {
      bVar1 = std::operator==(__lhs,"2");
      if (bVar1) {
        (*this->_vptr_MessageCracker[6])(this,message,sessionID);
      }
      else {
        bVar1 = std::operator==(__lhs,"3");
        if (bVar1) {
          (*this->_vptr_MessageCracker[7])(this,message,sessionID);
        }
        else {
          bVar1 = std::operator==(__lhs,"4");
          if (bVar1) {
            (*this->_vptr_MessageCracker[8])(this,message,sessionID);
          }
          else {
            bVar1 = std::operator==(__lhs,"5");
            if (bVar1) {
              (*this->_vptr_MessageCracker[9])(this,message,sessionID);
            }
            else {
              bVar1 = std::operator==(__lhs,"A");
              if (bVar1) {
                (*this->_vptr_MessageCracker[10])(this,message,sessionID);
              }
              else {
                bVar1 = std::operator==(__lhs,"n");
                if (bVar1) {
                  (*this->_vptr_MessageCracker[0xb])(this,message,sessionID);
                }
                else {
                  (*this->_vptr_MessageCracker[2])(this,message,sessionID);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void crack( const Message& message, 
              const FIX::SessionID& sessionID )
  {
    const std::string & msgTypeValue 
      = message.getHeader().getField( FIX::FIELD::MsgType );
    
    
    if( msgTypeValue == "0" )
      return onMessage( (const Heartbeat&)message, sessionID );
    
    if( msgTypeValue == "1" )
      return onMessage( (const TestRequest&)message, sessionID );
    
    if( msgTypeValue == "2" )
      return onMessage( (const ResendRequest&)message, sessionID );
    
    if( msgTypeValue == "3" )
      return onMessage( (const Reject&)message, sessionID );
    
    if( msgTypeValue == "4" )
      return onMessage( (const SequenceReset&)message, sessionID );
    
    if( msgTypeValue == "5" )
      return onMessage( (const Logout&)message, sessionID );
    
    if( msgTypeValue == "A" )
      return onMessage( (const Logon&)message, sessionID );
    
    if( msgTypeValue == "n" )
      return onMessage( (const XMLnonFIX&)message, sessionID );
    
    return onMessage( message, sessionID );
  }